

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O0

shared_ptr<SchemePair> __thiscall SchemeVector::to_list(SchemeVector *this)

{
  bool bVar1;
  reference __args_1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<SchemePair> sVar2;
  shared_ptr<SchemeObject> local_50 [2];
  undefined1 local_30 [16];
  const_reverse_iterator it;
  SchemeVector *this_local;
  shared_ptr<SchemePair> *l;
  
  it.current._M_current._7_1_ = 0;
  std::dynamic_pointer_cast<SchemePair,SchemeObject>((shared_ptr<SchemeObject> *)this);
  std::vector<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::
  rbegin((vector<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_> *)
         (local_30 + 8));
  while( true ) {
    std::vector<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::
    rend((vector<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_> *)
         local_30);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::shared_ptr<SchemeObject>_*,_std::vector<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_>_>
                             *)(local_30 + 8),
                            (reverse_iterator<__gnu_cxx::__normal_iterator<const_std::shared_ptr<SchemeObject>_*,_std::vector<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_>_>
                             *)local_30);
    if (!bVar1) break;
    __args_1 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<const_std::shared_ptr<SchemeObject>_*,_std::vector<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::shared_ptr<SchemeObject>_*,_std::vector<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_>_>
                            *)(local_30 + 8));
    std::make_shared<SchemePair,std::shared_ptr<SchemeObject>const&,std::shared_ptr<SchemePair>&>
              (local_50,(shared_ptr<SchemePair> *)__args_1);
    std::shared_ptr<SchemePair>::operator=
              ((shared_ptr<SchemePair> *)this,(shared_ptr<SchemePair> *)local_50);
    std::shared_ptr<SchemePair>::~shared_ptr((shared_ptr<SchemePair> *)local_50);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_std::shared_ptr<SchemeObject>_*,_std::vector<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::shared_ptr<SchemeObject>_*,_std::vector<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_>_>
                  *)(local_30 + 8));
  }
  sVar2.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<SchemePair>)sVar2.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SchemePair> SchemeVector::to_list() const
{
    auto l = std::dynamic_pointer_cast<SchemePair>(scheme_nil);
    for(auto it=vec.rbegin(); it != vec.rend(); ++it)
    {
        l = std::make_shared<SchemePair>(*it, l);
    }
    return l;
}